

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O0

void oggpackB_writetrunc(oggpack_buffer *b,long bits)

{
  long lVar1;
  long lVar2;
  long bytes;
  long bits_local;
  oggpack_buffer *b_local;
  
  lVar1 = bits >> 3;
  if (b->ptr != (uchar *)0x0) {
    lVar2 = bits + lVar1 * -8;
    b->ptr = b->buffer + lVar1;
    b->endbit = (int)lVar2;
    b->endbyte = lVar1;
    *b->ptr = *b->ptr & (byte)mask8B[lVar2];
  }
  return;
}

Assistant:

void oggpackB_writetrunc(oggpack_buffer *b,long bits){
  long bytes=bits>>3;
  if(b->ptr){
    bits-=bytes*8;
    b->ptr=b->buffer+bytes;
    b->endbit=bits;
    b->endbyte=bytes;
    *b->ptr&=mask8B[bits];
  }
}